

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::finish(cb_explore_adf *data)

{
  label *plVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->top_actions).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->scores).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->min_costs).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(data->max_costs).super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ::~_Vector_base(&(data->ex_as).
                   super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                 );
  std::_Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>::~_Vector_base
            (&(data->ex_costs).
              super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>);
  v_array<ACTION_SCORE::action_score>::delete_v(&data->action_probs);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(data->cs_labels).costs);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(data->cs_labels_2).costs);
  v_array<CB::label>::delete_v(&data->cb_labels);
  lVar3 = 0;
  for (uVar2 = 0; plVar1 = (data->prepped_cs_labels)._begin,
      uVar2 < (ulong)((long)(data->prepped_cs_labels)._end - (long)plVar1 >> 5); uVar2 = uVar2 + 1)
  {
    v_array<COST_SENSITIVE::wclass>::delete_v
              ((v_array<COST_SENSITIVE::wclass> *)((long)&(plVar1->costs)._begin + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  v_array<COST_SENSITIVE::label>::delete_v(&data->prepped_cs_labels);
  v_array<COST_SENSITIVE::wclass>::delete_v(&(data->gen_cs).pred_scores.costs);
  std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
            (&(data->gen_cs).mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>);
  return;
}

Assistant:

void finish(cb_explore_adf& data)
{
  data.top_actions.~vector<float>();
  data.scores.~vector<float>();
  data.min_costs.~vector<float>();
  data.max_costs.~vector<float>();
  data.ex_as.~vector<action_scores>();
  data.ex_costs.~vector<v_array<CB::cb_class>>();
  data.action_probs.delete_v();
  data.cs_labels.costs.delete_v();
  data.cs_labels_2.costs.delete_v();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
  data.gen_cs.mtr_ec_seq.~multi_ex();
}